

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O3

void __thiscall
indigox::utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
ResetIndicies(Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
              *this)

{
  StoredVertexList *pSVar1;
  element_type *peVar2;
  long *plVar3;
  AdjList *g;
  element_type *peVar4;
  size_t local_48;
  uid_t uStack_40;
  _List_node_base **local_38;
  uid_t local_30;
  
  boost::multi_index::
  multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
  ::clear_((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
            *)(*(ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                 **)((long)&(this->vert_idxmap_).super_relation_set.super_set_adaptor<_1e4cf98f_>.
                            super_ordered_associative_container_adaptor<_e8c6ae90_>.super_type.
                            super_type.dwfb + 8) + -8));
  boost::multi_index::
  multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
  ::clear_((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
            *)(*(ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                 **)((long)&(this->edge_idxmap_).super_relation_set.super_set_adaptor<_c9ff9997_>.
                            super_ordered_associative_container_adaptor<_7d573cef_>.super_type.
                            super_type.dwfb + 8) + -8));
  this->next_edge_id_ = 0;
  this->next_vert_id_ = 0;
  peVar4 = (this->graph_).
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pSVar1 = &(peVar4->super_type).m_vertices;
  plVar3 = *(long **)&(peVar4->super_type).m_vertices.
                      super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                      super__List_node_base;
  if ((StoredVertexList *)plVar3 != pSVar1) {
    do {
      local_48 = plVar3[2];
      uStack_40 = this->next_vert_id_;
      this->next_vert_id_ = uStack_40 + 1;
      boost::multi_index::
      multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
      ::insert_<boost::multi_index::detail::lvalue_tag>
                ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                  *)(*(ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                       **)((long)&(this->vert_idxmap_).super_relation_set.
                                  super_set_adaptor<_1e4cf98f_>.
                                  super_ordered_associative_container_adaptor<_e8c6ae90_>.super_type
                                  .super_type.dwfb + 8) + -8),&local_48);
      plVar3 = (long *)*plVar3;
    } while ((StoredVertexList *)plVar3 != pSVar1);
    peVar4 = (this->graph_).
             super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  }
  for (peVar2 = *(element_type **)
                 &(peVar4->super_type).m_edges.
                  super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
                  ._M_impl; peVar2 != peVar4;
      peVar2 = *(element_type **)
                &(peVar2->super_type).m_edges.
                 super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
                 ._M_impl) {
    local_38 = (_List_node_base **)
               ((long)&(peVar2->super_type).m_vertices.
                       super__List_base<void_*,_std::allocator<void_*>_>._M_impl + 8);
    local_30 = this->next_edge_id_;
    this->next_edge_id_ = local_30 + 1;
    local_48 = *(size_t *)
                ((long)&(peVar2->super_type).m_edges.
                        super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
                        ._M_impl + 0x10);
    uStack_40 = *(uid_t *)&(peVar2->super_type).m_vertices.
                           super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                           super__List_node_base;
    boost::multi_index::
    multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
    ::insert_<boost::multi_index::detail::lvalue_tag>
              ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                *)(*(ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                     **)((long)&(this->edge_idxmap_).super_relation_set.
                                super_set_adaptor<_c9ff9997_>.
                                super_ordered_associative_container_adaptor<_7d573cef_>.super_type.
                                super_type.dwfb + 8) + -8),&local_48);
  }
  return;
}

Assistant:

void ResetIndicies() {
        vert_idxmap_.clear();
        edge_idxmap_.clear();
        next_vert_id_ = 0;
        next_edge_id_ = 0;
        
        VertIterPair vs = GetVertices();
        while (vs.first != vs.second) {
          vert_idxmap_.insert({*vs.first, next_vert_id_++});
          ++vs.first;
        }
        
        EdgeIterPair es = GetEdges();
        while (es.first != es.second) {
          edge_idxmap_.insert({*es.first, next_edge_id_++});
          ++es.first;
        }
      }